

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O1

void __thiscall YAJLMiscData::fetch_comment(YAJLMiscData *this,bitio_stream *bstream)

{
  pointer *pppcVar1;
  bool bVar2;
  iterator __position;
  ssize_t sVar3;
  char *in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar4;
  void *extraout_RDX_02;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  char *com_data;
  char *local_30;
  
  bVar2 = this->ignore;
  sVar3 = bitio::bitio_stream::read(bstream,0x10,in_RDX,(size_t)in_RCX);
  if (bVar2 == false) {
    uVar6 = (int)sVar3 - 2;
    uVar7 = (ulong)(uVar6 & 0xffff);
    local_30 = (char *)operator_new__(uVar7);
    if ((short)uVar6 != 0) {
      uVar5 = 0;
      pvVar4 = extraout_RDX_01;
      do {
        sVar3 = bitio::bitio_stream::read(bstream,8,pvVar4,(size_t)in_RCX);
        local_30[uVar5] = (char)sVar3;
        uVar5 = uVar5 + 1;
        in_RCX = local_30;
        pvVar4 = extraout_RDX_02;
      } while (uVar7 != uVar5);
    }
    __position._M_current =
         (this->comments).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->comments).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                ((vector<char*,std::allocator<char*>> *)&this->comments,__position,&local_30);
    }
    else {
      *__position._M_current = local_30;
      pppcVar1 = &(this->comments).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  else {
    pvVar4 = extraout_RDX;
    for (uVar6 = (int)sVar3 + 0xfffeU & 0xffff; uVar6 != 0; uVar6 = uVar6 - 1) {
      bitio::bitio_stream::read(bstream,8,pvVar4,(size_t)in_RCX);
      pvVar4 = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void YAJLMiscData::fetch_comment(bitio::bitio_stream *bstream) {
    if (!ignore) {
        // param-length followed by comment-bytes.
        u16 length = bstream->read(0x10);
        length -= 2;
        auto *com_data = new char[length];
        for (int i = 0; i < length; i++) {
            com_data[i] = bstream->read(0x8);
        }
        comments.push_back(com_data);
    } else {
        u16 length = bstream->read(0x10);
        length -= 2;
        for (int i = 0; i < length; i++) {
            bstream->read(0x8);
        }
    }
}